

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

String * __thiscall
asl::Console::rgb(String *__return_storage_ptr__,Console *this,int r,int g,int b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  
  if (this->_colorMode == 2) {
    if (r < 1) {
      r = 0;
    }
    uVar4 = (ulong)(uint)r;
    if (0xfe < r) {
      uVar4 = 0xff;
    }
    if (g < 1) {
      g = 0;
    }
    if (0xfe < g) {
      g = 0xff;
    }
    if (b < 1) {
      b = 0;
    }
    if (0xfe < b) {
      b = 0xff;
    }
    String::String(__return_storage_ptr__,0xf,"2;%i;%i;%im",uVar4,(ulong)(uint)g,(ulong)(uint)b);
  }
  else {
    if (r < -0x13) {
      r = -0x14;
    }
    uVar1 = r + 0x14U;
    if (0xfe < r + 0x14U) {
      uVar1 = 0xff;
    }
    if (g < -0x13) {
      g = -0x14;
    }
    uVar2 = g + 0x14U;
    if (0xfe < g + 0x14U) {
      uVar2 = 0xff;
    }
    iVar5 = -0x14;
    if (-0x14 < b) {
      iVar5 = b;
    }
    uVar3 = iVar5 + 0x14U;
    if (0xfe < iVar5 + 0x14U) {
      uVar3 = 0xff;
    }
    String::String(__return_storage_ptr__,0xf,"5;%im",
                   (ulong)((uint)(byte)(((ushort)uVar3 & 0xff) / 0x33) +
                           (uint)(byte)(((ushort)uVar2 & 0xff) / 0x33) * 6 +
                           ((uint)(byte)(((ushort)uVar1 & 0xff) / 0x33) * 0x24 & 0xff) + 0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

String Console::rgb(int r, int g, int b) const
{
	const int o = 20;
	if (_colorMode == 2)
		return String(15, "2;%i;%i;%im", clamp(r, 0, 255), clamp(g, 0, 255), clamp(b, 0, 255));
	else
	{
		return String(15, "5;%im", 16 + 36 * (clamp(r + o, 0, 255) * 5 / 255) + 6 * (clamp(g + o, 0, 255) * 5 / 255) + (clamp(b + o, 0, 255) * 5 / 255));
		// if (approx r==g==b) -> use 232 + r/11
	}
}